

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O0

int isnt_at_loc(char *file,int line,char *got,char *expected,char *fmt,...)

{
  char in_AL;
  int test_00;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [40];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_58 [8];
  va_list args;
  int test;
  char *fmt_local;
  char *expected_local;
  char *got_local;
  int line_local;
  char *file_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_e0 = in_R9;
  test_00 = mystrcmp(got,expected);
  args[0].overflow_arg_area = local_108;
  args[0]._0_8_ = &stack0x00000008;
  local_58._4_4_ = 0x30;
  local_58._0_4_ = 0x28;
  vok_at_loc(file,line,test_00,fmt,(__va_list_tag *)local_58);
  if (test_00 == 0) {
    diag("         got: \'%s\'",got);
    diag("    expected: anything else");
  }
  return test_00;
}

Assistant:

int
isnt_at_loc (const char *file, int line, const char *got, const char *expected,
             const char *fmt, ...)
{
    int test = ne(got, expected);
    va_list args;
    va_start(args, fmt);
    vok_at_loc(file, line, test, fmt, args);
    va_end(args);
    if (!test) {
        diag("         got: '%s'", got);
        diag("    expected: anything else");
    }
    return test;
}